

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O1

bool __thiscall Regex::processSubTree(Regex *this,Element *cur_node,ParseData *data)

{
  bool bVar1;
  Element *pEVar2;
  Element *cur_node_00;
  bool bVar3;
  
  bVar3 = cur_node == (Element *)0x0;
  if ((!bVar3) && (bVar1 = processElement(this,cur_node,data), pEVar2 = cur_node, bVar1)) {
    do {
      if (((pEVar2->mType == TYPE_OR) ||
          ((pEVar2->mType == TYPE_CLASS ||
           (cur_node_00 = pEVar2->mChild, cur_node_00 == (Element *)0x0)))) &&
         (cur_node_00 = pEVar2->mNext, cur_node_00 == (Element *)0x0)) {
        bVar3 = false;
        cur_node_00 = pEVar2;
        do {
          cur_node_00 = cur_node_00->mParent;
          if (cur_node_00 == cur_node) {
            bVar3 = true;
            cur_node_00 = (Element *)0x0;
          }
          else if (cur_node_00->mNext != (Element *)0x0) {
            bVar3 = true;
            cur_node_00 = cur_node_00->mNext;
          }
        } while (!bVar3);
      }
      bVar3 = cur_node_00 == (Element *)0x0;
    } while ((!bVar3) &&
            (bVar1 = processElement(this,cur_node_00,data), pEVar2 = cur_node_00, bVar1));
  }
  return bVar3;
}

Assistant:

bool	Regex::processSubTree( Element *cur_node, ParseData *data )
{
	Element *top_node = cur_node;
	
	while( cur_node != NULL )
	{
		if ( processElement( cur_node, data ) == false )
			return false;
		
		if ( cur_node->mType != TYPE_CLASS && cur_node->mType != TYPE_OR && cur_node->mChild != NULL )
		{
			cur_node = cur_node->mChild;
		}
		else if ( cur_node->mNext != NULL )
		{
			cur_node = cur_node->mNext;
		}
		else 
		{
			bool done = false;
			while ( !done )
			{
				if ( top_node == cur_node->mParent )
				{
					done = true;
					cur_node = NULL;
				}
				else
				{
					cur_node = cur_node->mParent;
					if ( cur_node->mNext != NULL )
					{
						cur_node = cur_node->mNext;
						done = true;
					}
				}
			}
		}
	}
	
	return true;
}